

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_object.cpp
# Opt level: O3

value * __thiscall
mjs::anon_unknown_35::escape
          (value *__return_storage_ptr__,anon_unknown_35 *this,
          gc_heap_ptr<mjs::global_object> *global,wstring_view s)

{
  uint uVar1;
  gc_heap *this_00;
  char *pcVar2;
  long lVar3;
  uint val;
  wchar_t wVar4;
  wstring res;
  gc_heap_ptr_untyped local_80;
  wstring local_70;
  anon_unknown_35 *local_50;
  value *local_48;
  wstring_view local_40;
  
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = L'\0';
  if (global != (gc_heap_ptr<mjs::global_object> *)0x0) {
    lVar3 = 0;
    local_50 = this;
    local_48 = __return_storage_ptr__;
    do {
      uVar1 = *(uint *)(s._M_len + lVar3);
      val = uVar1 & 0xffff;
      wVar4 = (wchar_t)&local_70;
      if (val - 0x30 < 10 || (uVar1 & 0xffdf) - 0x41 < 0x1a) {
LAB_0014ee09:
        std::__cxx11::wstring::push_back(wVar4);
      }
      else {
        local_80.heap_._0_1_ = (undefined1)uVar1;
        pcVar2 = std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                           ("@*_+-./","",&local_80);
        if (pcVar2 != "") goto LAB_0014ee09;
        if (0xff < val) {
          std::__cxx11::wstring::push_back(wVar4);
          std::__cxx11::wstring::push_back(wVar4);
          std::__cxx11::wstring::push_back(wVar4);
          std::__cxx11::wstring::push_back(wVar4);
          std::__cxx11::wstring::push_back(wVar4);
          goto LAB_0014ee09;
        }
        anon_unknown_5::put_percent_hex_byte(&local_70,val);
      }
      lVar3 = lVar3 + 4;
      this = local_50;
      __return_storage_ptr__ = local_48;
    } while ((long)global << 2 != lVar3);
  }
  local_40._M_len = local_70._M_string_length;
  local_40._M_str = local_70._M_dataplus._M_p;
  string::string((string *)&local_80,*(gc_heap **)this,&local_40);
  __return_storage_ptr__->type_ = string;
  this_00 = (gc_heap *)CONCAT71(local_80.heap_._1_7_,local_80.heap_._0_1_);
  (__return_storage_ptr__->field_1).s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.
  heap_ = this_00;
  *(uint32_t *)((long)&__return_storage_ptr__->field_1 + 8) = local_80.pos_;
  if (this_00 != (gc_heap *)0x0) {
    gc_heap::attach(this_00,(gc_heap_ptr_untyped *)&(__return_storage_ptr__->field_1).s_);
  }
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT44(local_70.field_2._M_local_buf[1],local_70.field_2._M_local_buf[0]) * 4
                    + 4);
  }
  return __return_storage_ptr__;
}

Assistant:

value escape(const gc_heap_ptr<global_object>& global, const std::wstring_view s) {
    std::wstring res;
    for (uint16_t ch: s) {
        if (is_alpha_or_digit(ch) || is_in_list(ch, "@*_+-./")) {
            res.push_back(ch);
        } else if (ch > 255) {
            res.push_back('%');
            res.push_back('u');
            put_hex_byte(res, ch>>8);
            put_hex_byte(res, ch);
        } else {
            put_percent_hex_byte(res, ch);
        }
    }
    return value{string{global.heap(), res}};
}